

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O1

double icu_63::IslamicCalendar::moonAge(UDate time,UErrorCode *status)

{
  CalendarAstronomer *this;
  size_t in_RSI;
  double dVar1;
  
  umtx_lock_63(&astroLock);
  if (gIslamicCalendarAstro == (CalendarAstronomer *)0x0) {
    this = (CalendarAstronomer *)UMemory::operator_new((UMemory *)0x88,in_RSI);
    if (this == (CalendarAstronomer *)0x0) {
      this = (CalendarAstronomer *)0x0;
    }
    else {
      CalendarAstronomer::CalendarAstronomer(this);
    }
    gIslamicCalendarAstro = this;
    if (this == (CalendarAstronomer *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return 0.0;
    }
    ucln_i18n_registerCleanup_63(UCLN_I18N_ISLAMIC_CALENDAR,calendar_islamic_cleanup);
  }
  CalendarAstronomer::setTime(gIslamicCalendarAstro,time);
  dVar1 = CalendarAstronomer::getMoonAge(gIslamicCalendarAstro);
  umtx_unlock_63(&astroLock);
  dVar1 = (dVar1 * 180.0) / 3.141592653589793;
  return (double)(~-(ulong)(180.0 < dVar1) & (ulong)dVar1 |
                 (ulong)(dVar1 + -360.0) & -(ulong)(180.0 < dVar1));
}

Assistant:

double IslamicCalendar::moonAge(UDate time, UErrorCode &status)
{
    double age = 0;

    umtx_lock(&astroLock);
    if(gIslamicCalendarAstro == NULL) {
        gIslamicCalendarAstro = new CalendarAstronomer();
        if (gIslamicCalendarAstro == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return age;
        }
        ucln_i18n_registerCleanup(UCLN_I18N_ISLAMIC_CALENDAR, calendar_islamic_cleanup);
    }
    gIslamicCalendarAstro->setTime(time);
    age = gIslamicCalendarAstro->getMoonAge();
    umtx_unlock(&astroLock);

    // Convert to degrees and normalize...
    age = age * 180 / CalendarAstronomer::PI;
    if (age > 180) {
        age = age - 360;
    }

    return age;
}